

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

void rtr_mgr_cb(rtr_socket *sock,rtr_socket_state state,void *data_config,void *data_group)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  long lVar2;
  void *pvVar3;
  _Bool _Var4;
  long *plVar5;
  ulong uVar6;
  bool bVar7;
  char *frmt;
  rtr_mgr_group *group;
  long in_FS_OFFSET;
  rtr_mgr_status rStack_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (state == RTR_SHUTDOWN) {
    lrtr_dbg("RTR_MGR: Received RTR_SHUTDOWN callback");
  }
  if (data_group == (void *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      frmt = "RTR_MGR: ERROR: Socket has no group";
      goto LAB_0010466c;
    }
    goto LAB_001048b4;
  }
  switch(state) {
  case RTR_CONNECTING:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001048b4;
    rStack_40 = (uint)(*(int *)((long)data_group + 0x10) == 3) * 2 + RTR_MGR_CONNECTING;
    goto LAB_001048a0;
  case RTR_ESTABLISHED:
    if (*(int *)((long)data_group + 0x10) == 3) {
      pthread_rwlock_rdlock((pthread_rwlock_t *)((long)data_config + 0x10));
      plVar5 = *data_config;
      bVar7 = true;
      while (plVar5 = (long *)*plVar5, plVar5 != (long *)0x0) {
        pvVar3 = *(void **)(plVar5[2] + 0x20);
        if (((pvVar3 != data_group) && (*(int *)((long)pvVar3 + 0x10) != 0)) &&
           (*(int *)((long)pvVar3 + 0x10) != 3)) {
          bVar7 = (bool)(bVar7 & *(byte *)((long)data_group + 0xc) <= *(byte *)((long)pvVar3 + 0xc))
          ;
        }
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)((long)data_config + 0x10));
      if ((!bVar7) || (_Var4 = rtr_mgr_config_status_is_synced((rtr_mgr_group *)data_group), !_Var4)
         ) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          rStack_40 = RTR_MGR_ERROR;
          goto LAB_001048a0;
        }
        goto LAB_001048b4;
      }
    }
    else {
      if (*(int *)((long)data_group + 0x10) != 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        goto LAB_001048b4;
      }
      _Var4 = rtr_mgr_config_status_is_synced((rtr_mgr_group *)data_group);
      if (!_Var4) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          rStack_40 = RTR_MGR_CONNECTING;
          goto LAB_001048a0;
        }
        goto LAB_001048b4;
      }
    }
    set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,RTR_MGR_ESTABLISHED,sock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      rtr_mgr_close_less_preferable_groups
                (sock,(rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group);
      return;
    }
    goto LAB_001048b4;
  default:
    rStack_40 = *(rtr_mgr_status *)((long)data_group + 0x10);
    lVar2 = *(long *)(in_FS_OFFSET + 0x28);
    break;
  case RTR_ERROR_NO_DATA_AVAIL:
  case RTR_ERROR_FATAL:
  case RTR_ERROR_TRANSPORT:
    set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,RTR_MGR_ERROR,sock);
    __rwlock = (pthread_rwlock_t *)((long)data_config + 0x10);
    pthread_rwlock_rdlock(__rwlock);
    plVar5 = *data_config;
    do {
      plVar5 = (long *)*plVar5;
      if (plVar5 == (long *)0x0) {
        pthread_rwlock_unlock(__rwlock);
        pthread_rwlock_rdlock(__rwlock);
        plVar5 = *data_config;
        goto LAB_00104692;
      }
    } while (*(int *)(*(long *)(plVar5[2] + 0x20) + 0x10) != 2);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_rwlock_unlock(__rwlock);
      return;
    }
    goto LAB_001048b4;
  case RTR_SHUTDOWN:
    rStack_40 = RTR_MGR_CLOSED;
    uVar6 = 0;
    do {
      if (*(uint *)((long)data_group + 8) == uVar6) goto LAB_001046d6;
      lVar2 = uVar6 * 8;
      uVar6 = uVar6 + 1;
    } while (*(int *)(*(long *)(*data_group + lVar2) + 0x24) == 9);
    rStack_40 = *(rtr_mgr_status *)((long)data_group + 0x10);
LAB_001046d6:
    lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  }
  if (lVar2 == lVar1) {
LAB_001048a0:
    set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,rStack_40,sock);
    return;
  }
LAB_001048b4:
  __stack_chk_fail();
  while ((group = *(rtr_mgr_group **)(plVar5[2] + 0x20), group == (rtr_mgr_group *)data_group ||
         (group->status != RTR_MGR_CLOSED))) {
LAB_00104692:
    plVar5 = (long *)*plVar5;
    if (plVar5 == (long *)0x0) {
      group = (rtr_mgr_group *)0x0;
      break;
    }
  }
  pthread_rwlock_unlock(__rwlock);
  if (group == (rtr_mgr_group *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      frmt = "RTR_MGR: No other inactive groups found";
LAB_0010466c:
      lrtr_dbg(frmt);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    rtr_mgr_start_sockets(group);
    return;
  }
  goto LAB_001048b4;
}

Assistant:

static void rtr_mgr_cb(const struct rtr_socket *sock, const enum rtr_socket_state state, void *data_config,
		       void *data_group)
{
	if (state == RTR_SHUTDOWN)
		MGR_DBG1("Received RTR_SHUTDOWN callback");

	struct rtr_mgr_config *config = data_config;
	struct rtr_mgr_group *group = data_group;

	if (!group) {
		MGR_DBG1("ERROR: Socket has no group");
		return;
	}

	switch (state) {
	case RTR_SHUTDOWN:
		_rtr_mgr_cb_state_shutdown(sock, config, group);
		break;
	case RTR_ESTABLISHED:
		_rtr_mgr_cb_state_established(sock, config, group);
		break;
	case RTR_CONNECTING:
		_rtr_mgr_cb_state_connecting(sock, config, group);
		break;
	case RTR_ERROR_FATAL:
	case RTR_ERROR_TRANSPORT:
	case RTR_ERROR_NO_DATA_AVAIL:
		_rtr_mgr_cb_state_error(sock, config, group);
		break;
	default:
		set_status(config, group, group->status, sock);
	}
}